

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
ResizeIfLoadIsOutOfRange(InnerMap *this,size_type new_size)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  ulong in_RSI;
  long in_RDI;
  size_t in_stack_00000008;
  InnerMap *in_stack_00000010;
  size_type new_num_buckets;
  size_type hypothetical_size;
  size_type lg2_of_size_reduction_factor;
  size_type lo_cutoff;
  size_type hi_cutoff;
  size_type kMaxMapLoadTimes16;
  ulong local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  long local_40;
  long local_38;
  ulong local_30;
  ulong local_28;
  undefined8 local_20;
  
  local_20 = 0xc;
  local_30 = *(long *)(in_RDI + 8) * 0xc;
  local_28 = local_30 >> 4;
  local_30 = local_30 >> 6;
  if (in_RSI < local_28) {
    bVar2 = false;
    if (in_RSI <= local_30) {
      bVar2 = 8 < *(ulong *)(in_RDI + 8);
    }
    if (bVar2) {
      local_40 = (in_RSI * 5 >> 2) + 1;
      for (local_38 = 1; (ulong)(local_40 << ((byte)local_38 & 0x3f)) < local_28;
          local_38 = local_38 + 1) {
      }
      local_50 = 8;
      local_58 = *(ulong *)(in_RDI + 8) >> ((byte)local_38 & 0x3f);
      puVar4 = std::max<unsigned_long>(&local_50,&local_58);
      local_48 = *puVar4;
      if (local_48 != *(unsigned_long *)(in_RDI + 8)) {
        Resize(in_stack_00000010,in_stack_00000008);
        return true;
      }
    }
  }
  else {
    uVar1 = *(ulong *)(in_RDI + 8);
    sVar3 = max_size();
    if (uVar1 <= sVar3 >> 1) {
      Resize(in_stack_00000010,in_stack_00000008);
      return true;
    }
  }
  return false;
}

Assistant:

bool ResizeIfLoadIsOutOfRange(size_type new_size) {
      const size_type kMaxMapLoadTimes16 = 12;  // controls RAM vs CPU tradeoff
      const size_type hi_cutoff = num_buckets_ * kMaxMapLoadTimes16 / 16;
      const size_type lo_cutoff = hi_cutoff / 4;
      // We don't care how many elements are in trees.  If a lot are,
      // we may resize even though there are many empty buckets.  In
      // practice, this seems fine.
      if (PROTOBUF_PREDICT_FALSE(new_size >= hi_cutoff)) {
        if (num_buckets_ <= max_size() / 2) {
          Resize(num_buckets_ * 2);
          return true;
        }
      } else if (PROTOBUF_PREDICT_FALSE(new_size <= lo_cutoff &&
                                        num_buckets_ > kMinTableSize)) {
        size_type lg2_of_size_reduction_factor = 1;
        // It's possible we want to shrink a lot here... size() could even be 0.
        // So, estimate how much to shrink by making sure we don't shrink so
        // much that we would need to grow the table after a few inserts.
        const size_type hypothetical_size = new_size * 5 / 4 + 1;
        while ((hypothetical_size << lg2_of_size_reduction_factor) <
               hi_cutoff) {
          ++lg2_of_size_reduction_factor;
        }
        size_type new_num_buckets = std::max<size_type>(
            kMinTableSize, num_buckets_ >> lg2_of_size_reduction_factor);
        if (new_num_buckets != num_buckets_) {
          Resize(new_num_buckets);
          return true;
        }
      }
      return false;
    }